

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnTryTableCatch(TypeChecker *this,TypeVector *sig,Index depth)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Enum EVar3;
  char *prefix;
  TypeChecker *this_00;
  _anonymous_namespace_ *this_01;
  Label *label;
  Label *local_68;
  string local_60;
  string local_40;
  
  this_00 = this;
  RVar2 = GetLabel(this,depth,&local_68);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    this_01 = (_anonymous_namespace_ *)&local_68->result_types;
    if (local_68->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)&local_68->param_types;
    }
    RVar2 = CheckTypes(this_00,(TypeVector *)this_01,sig);
    prefix = (char *)(ulong)RVar2.enum_;
    EVar3 = Ok;
    if (RVar2.enum_ == Error) {
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_40,(_anonymous_namespace_ *)sig,(TypeVector *)0x0,prefix);
      _Var1._M_p = local_40._M_dataplus._M_p;
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_60,this_01,(TypeVector *)0x0,prefix);
      PrintError(this,"catch signature doesn\'t match target: expected %s, got %s",_Var1._M_p,
                 local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnTryTableCatch(const TypeVector& sig, Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckTypes(label_sig, sig);
  if (Failed(result)) {
    PrintError("catch signature doesn't match target: expected %s, got %s",
               TypesToString(sig).c_str(), TypesToString(label_sig).c_str());
  }
  return result;
}